

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void check_msacsr_cause(CPUMIPSState_conflict10 *env,uintptr_t retaddr)

{
  uintptr_t retaddr_local;
  CPUMIPSState_conflict10 *env_local;
  
  if (((env->active_tc).msacsr >> 0xc & 0x3fU & ((env->active_tc).msacsr >> 7 & 0x1fU | 0x20)) == 0)
  {
    (env->active_tc).msacsr =
         ((env->active_tc).msacsr >> 0xc & 0x1fU) << 2 | (env->active_tc).msacsr;
    return;
  }
  do_raise_exception(env,0x23,retaddr);
}

Assistant:

static inline void check_msacsr_cause(CPUMIPSState *env, uintptr_t retaddr)
{
    if ((GET_FP_CAUSE(env->active_tc.msacsr) &
            (GET_FP_ENABLE(env->active_tc.msacsr) | FP_UNIMPLEMENTED)) == 0) {
        UPDATE_FP_FLAGS(env->active_tc.msacsr,
                GET_FP_CAUSE(env->active_tc.msacsr));
    } else {
        do_raise_exception(env, EXCP_MSAFPE, retaddr);
    }
}